

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_distances.cc
# Opt level: O2

bool S2::AlwaysUpdateMinInteriorDistance<false>
               (S2Point *x,S2Point *a,S2Point *b,double xa2,double xb2,S1ChordAngle *min_dist)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  S1ChordAngle SVar5;
  S2Point c;
  S2Point cx;
  
  bVar1 = IsUnitLength(x);
  if (((bVar1) && (bVar1 = IsUnitLength(a), bVar1)) && (bVar1 = IsUnitLength(b), bVar1)) {
    c.c_[2] = x->c_[2] - a->c_[2];
    c.c_[0] = x->c_[0] - a->c_[0];
    c.c_[1] = x->c_[1] - a->c_[1];
    dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                      ((BasicVector<Vector3,_double,_3UL> *)&c);
    if ((dVar2 != xa2) || (NAN(dVar2) || NAN(xa2))) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&cx,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
                 ,0x56,kFatal,(ostream *)&std::cerr);
      std::operator<<((ostream *)cx.c_[1],"Check failed: (xa2) == ((x-a).Norm2()) ");
    }
    else {
      c.c_[2] = x->c_[2] - b->c_[2];
      c.c_[0] = x->c_[0] - b->c_[0];
      c.c_[1] = x->c_[1] - b->c_[1];
      dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                        ((BasicVector<Vector3,_double,_3UL> *)&c);
      if ((dVar2 == xb2) && (!NAN(dVar2) && !NAN(xb2))) {
        dVar2 = xb2;
        if (xb2 <= xa2) {
          dVar2 = xa2;
        }
        if (xa2 <= xb2) {
          xb2 = xa2;
        }
        c.c_[2] = a->c_[2] - b->c_[2];
        c.c_[0] = a->c_[0] - b->c_[0];
        c.c_[1] = a->c_[1] - b->c_[1];
        dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                          ((BasicVector<Vector3,_double,_3UL> *)&c);
        if (dVar2 < dVar3 + xb2) {
          RobustCrossProd((Vector3_d *)&c,a,b);
          dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                            ((BasicVector<Vector3,_double,_3UL> *)&c);
          dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                            ((BasicVector<Vector3,_double,_3UL> *)x,(D *)&c);
          if (dVar3 * dVar3 <= min_dist->length2_ * dVar2) {
            Vector3<double>::CrossProd(&c,x);
            dVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                              ((BasicVector<Vector3,_double,_3UL> *)a,&cx);
            if ((dVar4 < 0.0) &&
               (dVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                                  ((BasicVector<Vector3,_double,_3UL> *)b,&cx), 0.0 < dVar4)) {
              dVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                                ((BasicVector<Vector3,_double,_3UL> *)&cx);
              dVar4 = dVar4 / dVar2;
              if (dVar4 < 0.0) {
                dVar4 = sqrt(dVar4);
              }
              else {
                dVar4 = SQRT(dVar4);
              }
              dVar2 = (1.0 - dVar4) * (1.0 - dVar4) + (dVar3 * dVar3) / dVar2;
              if (dVar2 < min_dist->length2_) {
                SVar5 = S1ChordAngle::FromLength2(dVar2);
                min_dist->length2_ = (double)SVar5;
                return true;
              }
            }
          }
        }
        return false;
      }
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&cx,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
                 ,0x57,kFatal,(ostream *)&std::cerr);
      std::operator<<((ostream *)cx.c_[1],"Check failed: (xb2) == ((x-b).Norm2()) ");
    }
  }
  else {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&c,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
               ,0x55,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)c.c_[1],
                    "Check failed: S2::IsUnitLength(x) && S2::IsUnitLength(a) && S2::IsUnitLength(b) "
                   );
  }
  abort();
}

Assistant:

inline bool AlwaysUpdateMinInteriorDistance(
    const S2Point& x, const S2Point& a, const S2Point& b,
    double xa2, double xb2, S1ChordAngle* min_dist) {
  S2_DCHECK(S2::IsUnitLength(x) && S2::IsUnitLength(a) && S2::IsUnitLength(b));
  S2_DCHECK_EQ(xa2, (x-a).Norm2());
  S2_DCHECK_EQ(xb2, (x-b).Norm2());

  // The closest point on AB could either be one of the two vertices (the
  // "vertex case") or in the interior (the "interior case").  Let C = A x B.
  // If X is in the spherical wedge extending from A to B around the axis
  // through C, then we are in the interior case.  Otherwise we are in the
  // vertex case.
  //
  // Check whether we might be in the interior case.  For this to be true, XAB
  // and XBA must both be acute angles.  Checking this condition exactly is
  // expensive, so instead we consider the planar triangle ABX (which passes
  // through the sphere's interior).  The planar angles XAB and XBA are always
  // less than the corresponding spherical angles, so if we are in the
  // interior case then both of these angles must be acute.
  //
  // We check this by computing the squared edge lengths of the planar
  // triangle ABX, and testing acuteness using the law of cosines:
  //
  //             max(XA^2, XB^2) < min(XA^2, XB^2) + AB^2
  //
  if (max(xa2, xb2) >= min(xa2, xb2) + (a-b).Norm2()) {
    return false;
  }
  // The minimum distance might be to a point on the edge interior.  Let R
  // be closest point to X that lies on the great circle through AB.  Rather
  // than computing the geodesic distance along the surface of the sphere,
  // instead we compute the "chord length" through the sphere's interior.
  // If the squared chord length exceeds min_dist.length2() then we can
  // return "false" immediately.
  //
  // The squared chord length XR^2 can be expressed as XQ^2 + QR^2, where Q
  // is the point X projected onto the plane through the great circle AB.
  // The distance XQ^2 can be written as (X.C)^2 / |C|^2 where C = A x B.
  // We ignore the QR^2 term and instead use XQ^2 as a lower bound, since it
  // is faster and the corresponding distance on the Earth's surface is
  // accurate to within 1% for distances up to about 1800km.
  S2Point c = S2::RobustCrossProd(a, b);
  double c2 = c.Norm2();
  double x_dot_c = x.DotProd(c);
  double x_dot_c2 = x_dot_c * x_dot_c;
  if (!always_update && x_dot_c2 > c2 * min_dist->length2()) {
    // The closest point on the great circle AB is too far away.  We need to
    // test this using ">" rather than ">=" because the actual minimum bound
    // on the distance is (x_dot_c2 / c2), which can be rounded differently
    // than the (more efficient) multiplicative test above.
    return false;
  }
  // Otherwise we do the exact, more expensive test for the interior case.
  // This test is very likely to succeed because of the conservative planar
  // test we did initially.
  S2Point cx = c.CrossProd(x);
  if (a.DotProd(cx) >= 0 || b.DotProd(cx) <= 0) {
    return false;
  }
  // Compute the squared chord length XR^2 = XQ^2 + QR^2 (see above).
  // This calculation has good accuracy for all chord lengths since it
  // is based on both the dot product and cross product (rather than
  // deriving one from the other).  However, note that the chord length
  // representation itself loses accuracy as the angle approaches Pi.
  double qr = 1 - sqrt(cx.Norm2() / c2);
  double dist2 = (x_dot_c2 / c2) + (qr * qr);
  if (!always_update && dist2 >= min_dist->length2()) {
    return false;
  }
  *min_dist = S1ChordAngle::FromLength2(dist2);
  return true;
}